

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

bool __thiscall clipp::parser::operator()(parser *this,arg_string *arg)

{
  undefined4 uVar1;
  undefined4 uVar2;
  child_t<clipp::parameter,_clipp::group> *this_00;
  bool bVar3;
  char cVar4;
  
  uVar1 = this->index_;
  uVar2 = this->eaten_;
  this->index_ = uVar1 + 1;
  this->eaten_ = uVar2 + 1;
  if ((this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  if ((this->blocked_ == false) && (bVar3 = try_match(this,arg), bVar3)) {
    return true;
  }
  bVar3 = try_match_blocked(this,arg);
  if (bVar3) {
    return false;
  }
  if (((this->blocked_ == false) &&
      (bVar3 = detail::scoped_dfs_traverser::matched(&this->pos_), !bVar3)) &&
     (bVar3 = group::child_t<clipp::parameter,_clipp::group>::required
                        ((this->pos_).pos_.stack_.
                         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current), bVar3)) {
    this_00 = (this->pos_).pos_.stack_.
              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
    if (this_00->type_ == group) {
      cVar4 = group::blocking((group *)this_00);
    }
    else {
      if (this_00->type_ != param) goto LAB_00133066;
      cVar4 = *(bool *)((long)&this_00->m_ + 0x21);
    }
    if (cVar4 != '\0') {
      this->blocked_ = true;
    }
  }
LAB_00133066:
  std::vector<clipp::parser::arg_mapping,std::allocator<clipp::parser::arg_mapping>>::
  emplace_back<int&,std::__cxx11::string_const&>
            ((vector<clipp::parser::arg_mapping,std::allocator<clipp::parser::arg_mapping>> *)
             &this->args_,&this->index_,arg);
  return false;
}

Assistant:

bool operator() (const arg_string& arg)
    {
        ++eaten_;
        ++index_;

        if(!valid()) return false;

        if(!blocked_ && try_match(arg)) return true;

        if(try_match_blocked(arg)) return false;

        //skipping of blocking & required patterns is not allowed
        if(!blocked_ && !pos_.matched() && pos_->required() && pos_->blocking()) {
            blocked_ = true;
        }

        add_nomatch(arg);
        return false;
    }